

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMaterial.h
# Opt level: O2

bool __thiscall irr::video::SMaterial::isAlphaBlendOperation(SMaterial *this)

{
  float fVar1;
  
  if ((*(ushort *)&this->field_0xa2 & 0x780) != 0) {
    fVar1 = (float)this->BlendFactor;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      if (((uint)fVar1 >> 4 & 0xf) - 6 < 5) {
        return true;
      }
      if (((uint)fVar1 & 0xf) - 6 < 5) {
        return true;
      }
      if (((uint)fVar1 >> 0xc & 0xf) - 6 < 5) {
        return true;
      }
      if (0xfffffffa < ((uint)fVar1 >> 8 & 0xf) - 0xb) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool isAlphaBlendOperation() const
	{
		if (BlendOperation != EBO_NONE && BlendFactor != 0.f) {
			E_BLEND_FACTOR srcRGBFact = EBF_ZERO;
			E_BLEND_FACTOR dstRGBFact = EBF_ZERO;
			E_BLEND_FACTOR srcAlphaFact = EBF_ZERO;
			E_BLEND_FACTOR dstAlphaFact = EBF_ZERO;
			E_MODULATE_FUNC modulo = EMFN_MODULATE_1X;
			u32 alphaSource = 0;

			unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulo, alphaSource, BlendFactor);

			if (textureBlendFunc_hasAlpha(srcRGBFact) || textureBlendFunc_hasAlpha(dstRGBFact) ||
					textureBlendFunc_hasAlpha(srcAlphaFact) || textureBlendFunc_hasAlpha(dstAlphaFact)) {
				return true;
			}
		}
		return false;
	}